

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void __thiscall
wasm::Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::walkFunctionInModule
          (Walker<Mapper,_wasm::Visitor<Mapper,_void>_> *this,Function *func,Module *module)

{
  this->currModule = module;
  this->currFunction = func;
  wasm::ModuleUtils::ParallelFunctionAnalysis<std::unordered_set<wasm::Type,std::hash<wasm::
  Type>,std::equal_to<wasm::Type>,std::allocator<wasm::Type>>,(wasm::Mutability)0,wasm::ModuleUtils
  ::DefaultMap>::ParallelFunctionAnalysis(wasm::Module&,std::function<void(wasm::Function*,std::
  unordered_set<wasm::Type,std::hash<wasm::Type>,std::equal_to<wasm::Type>,std::allocator<wasm::
  Type>>&)>)::Mapper::doWalkFunction(wasm::Function__(&this[-1].stack.fixed._M_elems[9].currp,func);
  this->currFunction = (Function *)0x0;
  this->currModule = (Module *)0x0;
  return;
}

Assistant:

void walkFunctionInModule(Function* func, Module* module) {
    setModule(module);
    setFunction(func);
    static_cast<SubType*>(this)->doWalkFunction(func);
    static_cast<SubType*>(this)->visitFunction(func);
    setFunction(nullptr);
    setModule(nullptr);
  }